

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

void __thiscall soplex::SoPlexBase<double>::SoPlexBase(SoPlexBase<double> *this)

{
  int iVar1;
  SoPlexBase<double> *in_RDI;
  undefined4 in_stack_fffffffffffff838;
  TYPE in_stack_fffffffffffff83c;
  SPxSolverBase<double> *in_stack_fffffffffffff840;
  Settings *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff848;
  Statistics *newSettings;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff850;
  SoPlexBase<double> *this_01;
  undefined8 in_stack_fffffffffffff858;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff860;
  undefined8 in_stack_fffffffffffff868;
  SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff870;
  shared_ptr<soplex::Tolerances> *in_stack_fffffffffffff878;
  SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff880;
  SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *p;
  SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_fffffffffffff888;
  shared_ptr<soplex::Tolerances> *tolerances;
  longlong *in_stack_fffffffffffff890;
  SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_02;
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  *in_stack_fffffffffffff898;
  SPxBoundFlippingRT<double> *in_stack_fffffffffffff8a0;
  SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff8b0;
  char *in_stack_fffffffffffff8b8;
  SPxMainSM<double> *in_stack_fffffffffffff8c0;
  Setup mode;
  char *in_stack_fffffffffffff8c8;
  SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff8d0;
  undefined8 in_stack_fffffffffffff8d8;
  TYPE ttype;
  SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff8e0;
  SLUFactorRational *in_stack_fffffffffffff930;
  undefined8 in_stack_fffffffffffff9b0;
  TYPE ttype_00;
  undefined8 in_stack_fffffffffffff9b8;
  SPxSolverBase<double> *in_stack_fffffffffffff9c0;
  undefined8 in_stack_fffffffffffffa58;
  TYPE ttype_01;
  undefined8 in_stack_fffffffffffffa60;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffa68;
  undefined1 local_3b8 [16];
  shared_ptr<soplex::Tolerances> local_3a8 [10];
  undefined4 local_304;
  undefined4 local_300;
  undefined4 local_2fc;
  undefined8 local_2f8;
  undefined1 local_2f0 [56];
  undefined8 local_2b8;
  undefined1 local_2b0 [56];
  undefined8 local_278;
  undefined1 local_270 [56];
  undefined8 local_238;
  undefined1 local_230 [56];
  undefined8 local_1f8;
  undefined1 local_1f0 [56];
  undefined8 local_1b8;
  undefined1 local_1ac [76];
  Rational *local_160;
  Rational *local_158;
  Rational *local_150;
  Rational *local_148;
  Rational *local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined4 *local_128;
  Rational *local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined4 *local_108;
  Rational *local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined4 *local_e8;
  Rational *local_e0;
  undefined4 *local_d8;
  undefined4 *local_d0;
  undefined4 *local_c8;
  undefined8 local_c0;
  undefined8 *local_b8;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined8 *local_a0;
  undefined1 *local_98;
  undefined8 local_90;
  undefined8 *local_88;
  undefined1 *local_80;
  undefined8 local_78;
  undefined8 *local_70;
  undefined1 *local_68;
  undefined8 local_60;
  undefined8 *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined8 *local_40;
  undefined1 *local_38;
  undefined8 *local_30;
  undefined8 *local_28;
  undefined8 *local_20;
  undefined8 *local_18;
  undefined8 *local_10;
  undefined8 *local_8;
  
  ttype = (TYPE)((ulong)in_stack_fffffffffffff8d8 >> 0x20);
  ttype_01 = (TYPE)((ulong)in_stack_fffffffffffffa58 >> 0x20);
  ttype_00 = (TYPE)((ulong)in_stack_fffffffffffff9b0 >> 0x20);
  in_RDI->_vptr_SoPlexBase = (_func_int **)&PTR__SoPlexBase_004ebac0;
  SPxOut::SPxOut((SPxOut *)in_stack_fffffffffffff840);
  in_RDI->_statistics = (Statistics *)0x0;
  in_RDI->_currentSettings = (Settings *)0x0;
  std::shared_ptr<soplex::Tolerances>::shared_ptr((shared_ptr<soplex::Tolerances> *)0x1d2197);
  local_160 = &in_RDI->_rationalPosInfty;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x1d21c0);
  local_158 = &in_RDI->_rationalNegInfty;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x1d21ed);
  local_150 = &in_RDI->_rationalFeastol;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x1d221c);
  local_148 = &in_RDI->_rationalOpttol;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x1d224b);
  local_140 = &in_RDI->_rationalMaxscaleincr;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x1d227a);
  SPxSolverBase<double>::SPxSolverBase
            (in_stack_fffffffffffff9c0,(Type)((ulong)in_stack_fffffffffffff9b8 >> 0x20),
             (Representation)in_stack_fffffffffffff9b8,ttype_00);
  SLUFactor<double>::SLUFactor((SLUFactor<double> *)in_stack_fffffffffffff8e0);
  SPxMainSM<double>::SPxMainSM
            (in_stack_fffffffffffff8c0,(TYPE)((ulong)in_stack_fffffffffffff8b8 >> 0x20));
  Presol<double>::Presol((Presol<double> *)in_stack_fffffffffffff840,in_stack_fffffffffffff83c);
  SPxEquiliSC<double>::SPxEquiliSC
            ((SPxEquiliSC<double> *)in_stack_fffffffffffff840,
             SUB41(in_stack_fffffffffffff83c >> 0x18,0));
  SPxEquiliSC<double>::SPxEquiliSC
            ((SPxEquiliSC<double> *)in_stack_fffffffffffff840,
             SUB41(in_stack_fffffffffffff83c >> 0x18,0));
  SPxGeometSC<double>::SPxGeometSC
            ((SPxGeometSC<double> *)in_stack_fffffffffffff850,
             SUB81((ulong)in_stack_fffffffffffff848 >> 0x38,0),(int)in_stack_fffffffffffff848,
             (double)in_stack_fffffffffffff840,
             (double)CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
  SPxGeometSC<double>::SPxGeometSC
            ((SPxGeometSC<double> *)in_stack_fffffffffffff850,
             SUB81((ulong)in_stack_fffffffffffff848 >> 0x38,0),(int)in_stack_fffffffffffff848,
             (double)in_stack_fffffffffffff840,
             (double)CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
  SPxGeometSC<double>::SPxGeometSC
            ((SPxGeometSC<double> *)in_stack_fffffffffffff850,
             SUB81((ulong)in_stack_fffffffffffff848 >> 0x38,0),(int)in_stack_fffffffffffff848,
             (double)in_stack_fffffffffffff840,
             (double)CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
  SPxLeastSqSC<double>::SPxLeastSqSC((SPxLeastSqSC<double> *)in_stack_fffffffffffff840);
  SPxWeightST<double>::SPxWeightST((SPxWeightST<double> *)in_stack_fffffffffffff870);
  SPxSumST<double>::SPxSumST((SPxSumST<double> *)in_stack_fffffffffffff840);
  SPxVectorST<double>::SPxVectorST((SPxVectorST<double> *)in_stack_fffffffffffff850);
  SPxAutoPR<double>::SPxAutoPR((SPxAutoPR<double> *)in_stack_fffffffffffff850);
  SPxDantzigPR<double>::SPxDantzigPR((SPxDantzigPR<double> *)in_stack_fffffffffffff840);
  SPxParMultPR<double>::SPxParMultPR((SPxParMultPR<double> *)in_stack_fffffffffffff850);
  SPxDevexPR<double>::SPxDevexPR((SPxDevexPR<double> *)in_stack_fffffffffffff860);
  SPxSteepPR<double>::SPxSteepPR
            ((SPxSteepPR<double> *)in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,
             (Setup)((ulong)in_stack_fffffffffffff8b0 >> 0x20));
  mode = (Setup)((ulong)in_stack_fffffffffffff8c0 >> 0x20);
  SPxSteepExPR<double>::SPxSteepExPR((SPxSteepExPR<double> *)in_stack_fffffffffffff840);
  SPxDefaultRT<double>::SPxDefaultRT((SPxDefaultRT<double> *)in_stack_fffffffffffff840);
  SPxHarrisRT<double>::SPxHarrisRT((SPxHarrisRT<double> *)in_stack_fffffffffffff840);
  SPxFastRT<double>::SPxFastRT((SPxFastRT<double> *)in_stack_fffffffffffff840);
  SPxBoundFlippingRT<double>::SPxBoundFlippingRT(in_stack_fffffffffffff8a0);
  in_RDI->_simplifier = (SPxSimplifier<double> *)0x0;
  in_RDI->_scaler = (SPxScaler<double> *)0x0;
  in_RDI->_starter = (SPxStarter<double> *)0x0;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxSolverBase(in_stack_fffffffffffffa68,(Type)((ulong)in_stack_fffffffffffffa60 >> 0x20),
                  (Representation)in_stack_fffffffffffffa60,ttype_01);
  in_RDI->_initialPrecision = 0x32;
  in_RDI->_tolPrecisionRatio = 0.65;
  in_RDI->_epsZeroPrecisionRatio = 1.0;
  in_RDI->_epsFactorPrecisionRatio = 1.25;
  in_RDI->_epsUpdatePrecisionRatio = 1.0;
  in_RDI->_epsPivotPrecisionRatio = 0.625;
  SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SLUFactor(in_stack_fffffffffffff8e0);
  SPxAutoPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxAutoPR((SPxAutoPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)in_stack_fffffffffffff850);
  SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxDantzigPR((SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffff840);
  SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxParMultPR((SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffff850);
  SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxDevexPR(in_stack_fffffffffffff870);
  SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxSteepPR(in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,mode);
  SPxSteepExPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxSteepExPR((SPxSteepExPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffff840);
  SPxDefaultRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxDefaultRT((SPxDefaultRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffff840);
  SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxHarrisRT((SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_fffffffffffff840);
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxFastRT(in_stack_fffffffffffff860);
  SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxBoundFlippingRT(in_stack_fffffffffffff8b0);
  SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxEquiliSC((SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_fffffffffffff840,SUB41(in_stack_fffffffffffff83c >> 0x18,0));
  SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxEquiliSC((SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_fffffffffffff840,SUB41(in_stack_fffffffffffff83c >> 0x18,0));
  local_1b8 = 0x3feb333333333333;
  local_b0 = local_1ac;
  local_b8 = &local_1b8;
  local_c0 = 0;
  local_8 = local_b8;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff850,
             (double)in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  local_1f8 = 0x408f400000000000;
  local_98 = local_1f0;
  local_a0 = &local_1f8;
  local_a8 = 0;
  local_10 = local_a0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff850,
             (double)in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxGeometSC((SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_fffffffffffff860,SUB81((ulong)in_stack_fffffffffffff858 >> 0x38,0),
                (int)in_stack_fffffffffffff858,
                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  local_238 = 0x3feb333333333333;
  local_80 = local_230;
  local_88 = &local_238;
  local_90 = 0;
  local_18 = local_88;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff850,
             (double)in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  local_278 = 0x408f400000000000;
  local_68 = local_270;
  local_70 = &local_278;
  local_78 = 0;
  local_20 = local_70;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff850,
             (double)in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxGeometSC((SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_fffffffffffff860,SUB81((ulong)in_stack_fffffffffffff858 >> 0x38,0),
                (int)in_stack_fffffffffffff858,
                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  local_2b8 = 0x3feb333333333333;
  local_50 = local_2b0;
  local_58 = &local_2b8;
  local_60 = 0;
  local_28 = local_58;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff850,
             (double)in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  local_2f8 = 0x408f400000000000;
  local_38 = local_2f0;
  local_40 = &local_2f8;
  local_48 = 0;
  local_30 = local_40;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff850,
             (double)in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxGeometSC((SPxGeometSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_fffffffffffff860,SUB81((ulong)in_stack_fffffffffffff858 >> 0x38,0),
                (int)in_stack_fffffffffffff858,
                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  SPxLeastSqSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxLeastSqSC((SPxLeastSqSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffff860);
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxMainSM((SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)in_stack_fffffffffffff8e0,ttype);
  Presol<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::Presol((Presol<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)in_stack_fffffffffffff840,in_stack_fffffffffffff83c);
  VectorBase<double>::VectorBase((VectorBase<double> *)0x1d2bab);
  VectorBase<double>::VectorBase((VectorBase<double> *)0x1d2bc9);
  VectorBase<double>::VectorBase((VectorBase<double> *)0x1d2be7);
  VectorBase<double>::VectorBase((VectorBase<double> *)0x1d2c05);
  VectorBase<double>::VectorBase((VectorBase<double> *)0x1d2c23);
  SPxLPBase<double>::SPxLPBase((SPxLPBase<double> *)in_stack_fffffffffffff850);
  in_RDI->_rationalLP = (SPxLPRational *)0x0;
  SLUFactorRational::SLUFactorRational(in_stack_fffffffffffff930);
  DataArray<int>::DataArray
            ((DataArray<int> *)in_stack_fffffffffffff850,
             (int)((ulong)in_stack_fffffffffffff848 >> 0x20),(int)in_stack_fffffffffffff848,
             (Real)in_stack_fffffffffffff840);
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::LPColSetBase((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)in_stack_fffffffffffff870,(int)((ulong)in_stack_fffffffffffff868 >> 0x20),
                 (int)in_stack_fffffffffffff868);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)0x1d2cd7);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)0x1d2cf5);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)0x1d2d13);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)0x1d2d31);
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::DSVectorBase((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)in_stack_fffffffffffff850,(int)((ulong)in_stack_fffffffffffff848 >> 0x20));
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)0x1d2d72);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)0x1d2d90);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)0x1d2dae);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)0x1d2dcc);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)0x1d2dea);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)0x1d2e08);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)0x1d2e26);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)0x1d2e44);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)0x1d2e62);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)0x1d2e80);
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::DSVectorBase((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)in_stack_fffffffffffff850,(int)((ulong)in_stack_fffffffffffff848 >> 0x20));
  DataArray<soplex::SPxSolverBase<double>::VarStatus>::DataArray
            ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)in_stack_fffffffffffff850,
             (int)((ulong)in_stack_fffffffffffff848 >> 0x20),(int)in_stack_fffffffffffff848,
             (Real)in_stack_fffffffffffff840);
  DataArray<soplex::SPxSolverBase<double>::VarStatus>::DataArray
            ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)in_stack_fffffffffffff850,
             (int)((ulong)in_stack_fffffffffffff848 >> 0x20),(int)in_stack_fffffffffffff848,
             (Real)in_stack_fffffffffffff840);
  Array<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_*>
  ::Array((Array<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_*>
           *)in_stack_fffffffffffff850,(int)((ulong)in_stack_fffffffffffff848 >> 0x20));
  DataArray<soplex::SoPlexBase<double>::RangeType>::DataArray
            ((DataArray<soplex::SoPlexBase<double>::RangeType> *)in_stack_fffffffffffff850,
             (int)((ulong)in_stack_fffffffffffff848 >> 0x20),(int)in_stack_fffffffffffff848,
             (Real)in_stack_fffffffffffff840);
  DataArray<soplex::SoPlexBase<double>::RangeType>::DataArray
            ((DataArray<soplex::SoPlexBase<double>::RangeType> *)in_stack_fffffffffffff850,
             (int)((ulong)in_stack_fffffffffffff848 >> 0x20),(int)in_stack_fffffffffffff848,
             (Real)in_stack_fffffffffffff840);
  in_RDI->_status = UNKNOWN;
  DataArray<soplex::SPxSolverBase<double>::VarStatus>::DataArray
            ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)in_stack_fffffffffffff850,
             (int)((ulong)in_stack_fffffffffffff848 >> 0x20),(int)in_stack_fffffffffffff848,
             (Real)in_stack_fffffffffffff840);
  DataArray<soplex::SPxSolverBase<double>::VarStatus>::DataArray
            ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)in_stack_fffffffffffff850,
             (int)((ulong)in_stack_fffffffffffff848 >> 0x20),(int)in_stack_fffffffffffff848,
             (Real)in_stack_fffffffffffff840);
  DataArray<soplex::SPxSolverBase<double>::VarStatus>::DataArray
            ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)in_stack_fffffffffffff850,
             (int)((ulong)in_stack_fffffffffffff848 >> 0x20),(int)in_stack_fffffffffffff848,
             (Real)in_stack_fffffffffffff840);
  DataArray<soplex::SPxSolverBase<double>::VarStatus>::DataArray
            ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)in_stack_fffffffffffff850,
             (int)((ulong)in_stack_fffffffffffff848 >> 0x20),(int)in_stack_fffffffffffff848,
             (Real)in_stack_fffffffffffff840);
  DataArray<soplex::SPxSolverBase<double>::VarStatus>::DataArray
            ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)in_stack_fffffffffffff850,
             (int)((ulong)in_stack_fffffffffffff848 >> 0x20),(int)in_stack_fffffffffffff848,
             (Real)in_stack_fffffffffffff840);
  DataArray<soplex::SPxSolverBase<double>::VarStatus>::DataArray
            ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)in_stack_fffffffffffff850,
             (int)((ulong)in_stack_fffffffffffff848 >> 0x20),(int)in_stack_fffffffffffff848,
             (Real)in_stack_fffffffffffff840);
  DataArray<soplex::SPxSolverBase<double>::VarStatus>::DataArray
            ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)in_stack_fffffffffffff850,
             (int)((ulong)in_stack_fffffffffffff848 >> 0x20),(int)in_stack_fffffffffffff848,
             (Real)in_stack_fffffffffffff840);
  DataArray<soplex::SPxSolverBase<double>::VarStatus>::DataArray
            ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)in_stack_fffffffffffff850,
             (int)((ulong)in_stack_fffffffffffff848 >> 0x20),(int)in_stack_fffffffffffff848,
             (Real)in_stack_fffffffffffff840);
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  ::DataArray((DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               *)in_stack_fffffffffffff850,(int)((ulong)in_stack_fffffffffffff848 >> 0x20),
              (int)in_stack_fffffffffffff848,(Real)in_stack_fffffffffffff840);
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  ::DataArray((DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               *)in_stack_fffffffffffff850,(int)((ulong)in_stack_fffffffffffff848 >> 0x20),
              (int)in_stack_fffffffffffff848,(Real)in_stack_fffffffffffff840);
  SolBase<double>::SolBase((SolBase<double> *)in_stack_fffffffffffff880);
  SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::SolBase(in_stack_fffffffffffff888);
  SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::SolBase(in_stack_fffffffffffff888);
  in_RDI->_hasBasis = false;
  in_RDI->_hasSolReal = false;
  in_RDI->_hasSolRational = false;
  local_120 = &in_RDI->_rationalPosone;
  local_2fc = 1;
  local_128 = &local_2fc;
  local_130 = 0;
  local_138 = 1;
  local_c8 = local_128;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor<long_long>
            (in_stack_fffffffffffff898,in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  local_100 = &in_RDI->_rationalNegone;
  local_300 = 0xffffffff;
  local_108 = &local_300;
  local_110 = 0;
  local_118 = 0xffffffffffffffff;
  local_d0 = local_108;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor<long_long>
            (in_stack_fffffffffffff898,in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  local_e0 = &in_RDI->_rationalZero;
  local_304 = 0;
  local_e8 = &local_304;
  local_f0 = 0;
  local_f8 = 0;
  local_d8 = local_e8;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor<long_long>
            (in_stack_fffffffffffff898,in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  std::make_shared<soplex::Tolerances>();
  std::shared_ptr<soplex::Tolerances>::operator=
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff840,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x1d335e);
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff840,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
  SPxSolverBase<double>::setTolerances
            ((SPxSolverBase<double> *)in_stack_fffffffffffff850,
             (shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff848);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x1d33b5);
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff840,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances(in_stack_fffffffffffff850,
                  (shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff848);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x1d340b);
  SPxScaler<double>::setTolerances
            ((SPxScaler<double> *)in_stack_fffffffffffff840,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
  SPxScaler<double>::setTolerances
            ((SPxScaler<double> *)in_stack_fffffffffffff840,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
  SPxScaler<double>::setTolerances
            ((SPxScaler<double> *)in_stack_fffffffffffff840,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
  SPxScaler<double>::setTolerances
            ((SPxScaler<double> *)in_stack_fffffffffffff840,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
  SPxScaler<double>::setTolerances
            ((SPxScaler<double> *)in_stack_fffffffffffff840,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
  SPxScaler<double>::setTolerances
            ((SPxScaler<double> *)in_stack_fffffffffffff840,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances((SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_stack_fffffffffffff840,
                  (shared_ptr<soplex::Tolerances> *)
                  CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances((SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_stack_fffffffffffff840,
                  (shared_ptr<soplex::Tolerances> *)
                  CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances((SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_stack_fffffffffffff840,
                  (shared_ptr<soplex::Tolerances> *)
                  CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances((SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_stack_fffffffffffff840,
                  (shared_ptr<soplex::Tolerances> *)
                  CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances((SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_stack_fffffffffffff840,
                  (shared_ptr<soplex::Tolerances> *)
                  CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances((SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_stack_fffffffffffff840,
                  (shared_ptr<soplex::Tolerances> *)
                  CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff840,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
  SPxBoundFlippingRT<double>::setTolerances
            ((SPxBoundFlippingRT<double> *)in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x1d35bd);
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff840,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
  SPxRatioTester<double>::setTolerances
            ((SPxRatioTester<double> *)in_stack_fffffffffffff840,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x1d3613);
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff840,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
  SPxRatioTester<double>::setTolerances
            ((SPxRatioTester<double> *)in_stack_fffffffffffff840,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x1d3669);
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff840,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
  SPxRatioTester<double>::setTolerances
            ((SPxRatioTester<double> *)in_stack_fffffffffffff840,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x1d36b9);
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff840,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
  SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x1d3703);
  this_02 = (SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)&in_RDI->_boostedRatiotesterFast;
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff840,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances((SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_stack_fffffffffffff840,
                  (shared_ptr<soplex::Tolerances> *)
                  CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x1d374d);
  p = &in_RDI->_boostedRatiotesterHarris;
  tolerances = local_3a8;
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff840,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances((SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_stack_fffffffffffff840,
                  (shared_ptr<soplex::Tolerances> *)
                  CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x1d3797);
  iVar1 = (int)((ulong)local_3b8 >> 0x20);
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff840,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances((SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_stack_fffffffffffff840,
                  (shared_ptr<soplex::Tolerances> *)
                  CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x1d37e1);
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff840,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
  SLUFactor<double>::setTolerances((SLUFactor<double> *)this_02,tolerances);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x1d382b);
  this_01 = (SoPlexBase<double> *)&in_RDI->_boostedSlufactor;
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff840,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
  SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances(this_02,tolerances);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x1d3875);
  SPxSolverBase<double>::setOutstream(&in_RDI->_solver,&in_RDI->spxout);
  SPxScaler<double>::setOutstream(&(in_RDI->_scalerUniequi).super_SPxScaler<double>,&in_RDI->spxout)
  ;
  SPxScaler<double>::setOutstream(&(in_RDI->_scalerBiequi).super_SPxScaler<double>,&in_RDI->spxout);
  SPxScaler<double>::setOutstream(&(in_RDI->_scalerGeo1).super_SPxScaler<double>,&in_RDI->spxout);
  SPxScaler<double>::setOutstream(&(in_RDI->_scalerGeo8).super_SPxScaler<double>,&in_RDI->spxout);
  SPxScaler<double>::setOutstream(&(in_RDI->_scalerGeoequi).super_SPxScaler<double>,&in_RDI->spxout)
  ;
  SPxScaler<double>::setOutstream(&(in_RDI->_scalerLeastsq).super_SPxScaler<double>,&in_RDI->spxout)
  ;
  SPxSolverBase<double>::setBasisSolver
            (in_stack_fffffffffffff840,
             (SLinSolver<double> *)CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838),
             false);
  in_RDI->_realLP = &(in_RDI->_solver).super_SPxLPBase<double>;
  in_RDI->_isRealLPLoaded = true;
  in_RDI->_isRealLPScaled = false;
  in_RDI->_applyPolishing = false;
  in_RDI->_optimizeCalls = 0;
  in_RDI->_unscaleCalls = 0;
  SPxLPBase<double>::setOutstream(in_RDI->_realLP,&in_RDI->spxout);
  spx_alloc<soplex::SoPlexBase<double>::Statistics*>((Statistics **)p,iVar1);
  newSettings = in_RDI->_statistics;
  Statistics::Statistics((Statistics *)in_stack_fffffffffffff840,in_stack_fffffffffffff83c);
  in_RDI->_statistics = newSettings;
  spx_alloc<soplex::SoPlexBase<double>::Settings*>((Settings **)p,iVar1);
  this_00 = in_RDI->_currentSettings;
  Settings::Settings(this_00);
  in_RDI->_currentSettings = this_00;
  setSettings(this_01,(Settings *)newSettings,SUB81((ulong)this_00 >> 0x38,0));
  iVar1 = intParam(in_RDI,SOLVEMODE);
  in_RDI->_lastSolveMode = iVar1;
  SPxSimplifier<double>::setOutstream
            (&(in_RDI->_simplifierPaPILO).super_SPxSimplifier<double>,&in_RDI->spxout);
  return;
}

Assistant:

SoPlexBase<R>::SoPlexBase()
   : _statistics(nullptr)
   , _currentSettings(nullptr)
   , _scalerUniequi(false)
   , _scalerBiequi(true)
   , _scalerGeo1(false, 1)
   , _scalerGeo8(false, 8)
   , _scalerGeoequi(true)
   , _scalerLeastsq()
   , _simplifier(nullptr)
   , _scaler(nullptr)
   , _starter(nullptr)
   , _rationalLP(nullptr)
   , _unitMatrixRational(0)
   , _status(SPxSolverBase<R>::UNKNOWN)
   , _hasBasis(false)
   , _hasSolReal(false)
   , _hasSolRational(false)
   , _rationalPosone(1)
   , _rationalNegone(-1)
   , _rationalZero(0)
{
   _tolerances = std::make_shared<Tolerances>();
   _solver.setTolerances(_tolerances);
   _boostedSolver.setTolerances(_tolerances);
   // set tolerances for scalers
   _scalerUniequi.setTolerances(_tolerances);
   _scalerBiequi.setTolerances(_tolerances);
   _scalerGeo1.setTolerances(_tolerances);
   _scalerGeo8.setTolerances(_tolerances);
   _scalerGeoequi.setTolerances(_tolerances);
   _scalerLeastsq.setTolerances(_tolerances);

   _boostedScalerUniequi.setTolerances(_tolerances);
   _boostedScalerBiequi.setTolerances(_tolerances);
   _boostedScalerGeo1.setTolerances(_tolerances);
   _boostedScalerGeo8.setTolerances(_tolerances);
   _boostedScalerGeoequi.setTolerances(_tolerances);
   _boostedScalerLeastsq.setTolerances(_tolerances);

   // set tolerances for ratio testers
   _ratiotesterBoundFlipping.setTolerances(_tolerances);
   _ratiotesterFast.setTolerances(_tolerances);
   _ratiotesterHarris.setTolerances(_tolerances);
   _ratiotesterTextbook.setTolerances(_tolerances);

   _boostedRatiotesterBoundFlipping.setTolerances(_tolerances);
   _boostedRatiotesterFast.setTolerances(_tolerances);
   _boostedRatiotesterHarris.setTolerances(_tolerances);
   _boostedRatiotesterTextbook.setTolerances(_tolerances);

   // set tolerances for slufactor
   _slufactor.setTolerances(_tolerances);
   _boostedSlufactor.setTolerances(_tolerances);
   // transfer message handler
   _solver.setOutstream(spxout);
   _scalerUniequi.setOutstream(spxout);
   _scalerBiequi.setOutstream(spxout);
   _scalerGeo1.setOutstream(spxout);
   _scalerGeo8.setOutstream(spxout);
   _scalerGeoequi.setOutstream(spxout);
   _scalerLeastsq.setOutstream(spxout);

   // give lu factorization to solver
   _solver.setBasisSolver(&_slufactor);

#ifdef SOPLEX_WITH_MPFR
   // set initial precision
   BP::default_precision(_initialPrecision);

   _boostedSolver.setOutstream(spxout);
   _boostedScalerUniequi.setOutstream(spxout);
   _boostedScalerBiequi.setOutstream(spxout);
   _boostedScalerGeo1.setOutstream(spxout);
   _boostedScalerGeo8.setOutstream(spxout);
   _boostedScalerGeoequi.setOutstream(spxout);
   _boostedScalerLeastsq.setOutstream(spxout);

   _boostedSolver.setBasisSolver(&_boostedSlufactor);

   _lastStallPrecBoosts = 0;
   _factorSolNewBasisPrecBoost = true;
   _nextRatrecPrecBoost = 0;
   _prevIterations = 0;

   _switchedToBoosted = false;

   _certificateMode = 0;
   _hasOldBasis     = false;
   _hasOldFeasBasis = false;
   _hasOldUnbdBasis = false;

   _boostingLimitReached = false;
#endif

   // the R LP is initially stored in the solver; the rational LP is constructed, when the parameter SYNCMODE is
   // initialized in setSettings() below
   _realLP = &_solver;
   _isRealLPLoaded = true;
   _isRealLPScaled = false;
   _applyPolishing = false;
   _optimizeCalls = 0;
   _unscaleCalls = 0;
   _realLP->setOutstream(spxout);

   // initialize statistics
   spx_alloc(_statistics);
   _statistics = new(_statistics) Statistics();

   // initialize parameter settings to default
   spx_alloc(_currentSettings);
   _currentSettings = new(_currentSettings) Settings();
   setSettings(*_currentSettings, true);

   _lastSolveMode = intParam(SoPlexBase<R>::SOLVEMODE);

   _simplifierPaPILO.setOutstream(spxout);

   assert(_isConsistent());
}